

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexExtractBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pVVar1;
  vector<duckdb::Value,_true> *pvVar2;
  bool bVar3;
  int iVar4;
  uint __val;
  reference pvVar5;
  type pEVar6;
  pointer pEVar7;
  iterator iVar8;
  BinderException *pBVar9;
  ParameterNotResolvedException *this_00;
  InvalidInputException *pIVar10;
  pointer this_01;
  bool constant_pattern;
  allocator local_2d9;
  ScalarFunction *local_2d8;
  Options local_2d0;
  vector<duckdb::Value,_true> *local_2b8;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_2b0;
  string group_name;
  child_list_t<LogicalType> struct_children;
  RE2 constant_pattern_1;
  case_insensitive_set_t name_collision_set;
  string group_string;
  string constant_string;
  child_list_t<LogicalType> local_158;
  StringPiece constant_piece;
  Value group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2d0.max_mem_ = 0x800000;
  local_2d0.encoding_ = EncodingUTF8;
  local_2d0.posix_syntax_ = false;
  local_2d0.longest_match_ = false;
  local_2d0.log_errors_ = true;
  local_2d0.literal_ = false;
  local_2d0.never_nl_ = false;
  local_2d0.dot_nl_ = false;
  local_2d0.never_capture_ = false;
  local_2d0.case_sensitive_ = true;
  local_2d0.perl_classes_ = false;
  local_2d0.word_boundary_ = false;
  local_2d0.one_line_ = false;
  constant_string._M_dataplus._M_p = (pointer)&constant_string.field_2;
  constant_string._M_string_length = 0;
  constant_string.field_2._M_local_buf[0] = '\0';
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar5);
  bVar3 = regexp_util::TryParseConstantPattern(context,pEVar6,&constant_string);
  constant_pattern = bVar3;
  if (0x18 < (ulong)((long)(arguments->
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,3);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar5);
    regexp_util::ParseRegexOptions(context,pEVar6,&local_2d0,(bool *)0x0);
  }
  ::std::__cxx11::string::string((string *)&group_string,"\\0",(allocator *)&constant_pattern_1);
  if (0x10 < (ulong)((long)(arguments->
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,2);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
    if ((char)iVar4 != '\0') {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,2);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar7);
    if ((char)iVar4 == '\0') {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&constant_pattern_1,"Group specification field must be a constant!",
                 (allocator *)&group);
      InvalidInputException::InvalidInputException(pIVar10,(string *)&constant_pattern_1);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,2);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar5);
    ExpressionExecutor::EvaluateScalar(&group,context,pEVar6,false);
    if (group.is_null == true) {
      ::std::__cxx11::string::assign((char *)&group_string);
    }
    else if (group.type_.id_ == LIST) {
      if (!bVar3) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&constant_pattern_1,"%s with LIST requires a constant pattern",
                   (allocator *)&name_collision_set);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                    name);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar9,(string *)&constant_pattern_1,&local_50);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_2b8 = ListValue::GetChildren(&group);
      local_2d8 = bound_function;
      local_2b0._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
      if ((local_2b8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (local_2b8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&constant_pattern_1,"%s requires non-empty lists of capture names",
                   (allocator *)&name_collision_set);
        ::std::__cxx11::string::string
                  ((string *)&local_70,
                   (string *)
                   &(local_2d8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar9,(string *)&constant_pattern_1,&local_70);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      name_collision_set._M_h._M_buckets = &name_collision_set._M_h._M_single_bucket;
      name_collision_set._M_h._M_bucket_count = 1;
      name_collision_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      name_collision_set._M_h._M_element_count = 0;
      name_collision_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      struct_children.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      name_collision_set._M_h._M_rehash_policy._M_next_resize = 0;
      name_collision_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
      struct_children.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      struct_children.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar1 = (local_2b8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_01 = (local_2b8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start; this_01 != pVVar1; this_01 = this_01 + 1) {
        if (this_01->is_null == true) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&constant_pattern_1,"NULL group name in %s",(allocator *)&group_name)
          ;
          ::std::__cxx11::string::string
                    ((string *)&local_90,
                     (string *)
                     &(local_2d8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                    );
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar9,(string *)&constant_pattern_1,&local_90);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        Value::ToString_abi_cxx11_(&group_name,this_01);
        iVar8 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&name_collision_set._M_h,&group_name);
        if (iVar8.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&constant_pattern_1,"Duplicate group name \"%s\" in %s",
                     (allocator *)&constant_piece);
          ::std::__cxx11::string::string((string *)&local_b0,(string *)&group_name);
          ::std::__cxx11::string::string
                    ((string *)&local_d0,
                     (string *)
                     &(local_2d8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                    );
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar9,(string *)&constant_pattern_1,&local_b0,&local_d0);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&name_collision_set._M_h,&group_name);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
                    *)&constant_pattern_1,&group_name,&LogicalType::VARCHAR);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalTypeId>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&struct_children,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
                    *)&constant_pattern_1);
        ::std::__cxx11::string::~string((string *)&constant_pattern_1);
        ::std::__cxx11::string::~string((string *)&group_name);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_158,
               &struct_children.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              );
      LogicalType::STRUCT((LogicalType *)&constant_pattern_1,&local_158);
      this = (duckdb *)
             local_2b0._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      pvVar2 = local_2b8;
      LogicalType::operator=
                (&(local_2d8->super_BaseScalarFunction).return_type,
                 (LogicalType *)&constant_pattern_1);
      LogicalType::~LogicalType((LogicalType *)&constant_pattern_1);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_158);
      constant_piece.data_ = constant_string._M_dataplus._M_p;
      constant_piece.size_ = constant_string._M_string_length;
      duckdb_re2::RE2::RE2(&constant_pattern_1,&constant_piece,&local_2d0);
      if ((ulong)(long)constant_pattern_1.num_captures_ <
          (ulong)((long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar2->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_name,"Not enough group names in %s",&local_2d9);
        ::std::__cxx11::string::string
                  ((string *)&local_f0,
                   (string *)
                   &(local_2d8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
        BinderException::BinderException<std::__cxx11::string>(pBVar9,&group_name,&local_f0);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      duckdb_re2::RE2::~RE2(&constant_pattern_1);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&struct_children);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&name_collision_set._M_h);
    }
    else {
      __val = Value::GetValue<int>(&group);
      if (9 < __val) {
        pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&constant_pattern_1,"Group index must be between 0 and 9!",
                   (allocator *)&name_collision_set);
        InvalidInputException::InvalidInputException(pIVar10,(string *)&constant_pattern_1);
        __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::to_string((string *)&name_collision_set,__val);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constant_pattern_1,"\\",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &name_collision_set);
      ::std::__cxx11::string::operator=((string *)&group_string,(string *)&constant_pattern_1);
      ::std::__cxx11::string::~string((string *)&constant_pattern_1);
      ::std::__cxx11::string::~string((string *)&name_collision_set);
    }
    Value::~Value(&group);
  }
  make_uniq<duckdb::RegexpExtractBindData,duckdb_re2::RE2::Options&,std::__cxx11::string,bool&,std::__cxx11::string>
            ((duckdb *)&constant_pattern_1,&local_2d0,&constant_string,&constant_pattern,
             &group_string);
  *(string **)this = constant_pattern_1.pattern_;
  ::std::__cxx11::string::~string((string *)&group_string);
  ::std::__cxx11::string::~string((string *)&constant_string);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> RegexExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() >= 2);

	duckdb_re2::RE2::Options options;

	string constant_string;
	bool constant_pattern = TryParseConstantPattern(context, *arguments[1], constant_string);

	if (arguments.size() >= 4) {
		ParseRegexOptions(context, *arguments[3], options);
	}

	string group_string = "\\0";
	if (arguments.size() >= 3) {
		if (arguments[2]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[2]->IsFoldable()) {
			throw InvalidInputException("Group specification field must be a constant!");
		}
		Value group = ExpressionExecutor::EvaluateScalar(context, *arguments[2]);
		if (group.IsNull()) {
			group_string = "";
		} else if (group.type().id() == LogicalTypeId::LIST) {
			if (!constant_pattern) {
				throw BinderException("%s with LIST requires a constant pattern", bound_function.name);
			}
			auto &list_children = ListValue::GetChildren(group);
			if (list_children.empty()) {
				throw BinderException("%s requires non-empty lists of capture names", bound_function.name);
			}
			case_insensitive_set_t name_collision_set;
			child_list_t<LogicalType> struct_children;
			for (const auto &child : list_children) {
				if (child.IsNull()) {
					throw BinderException("NULL group name in %s", bound_function.name);
				}
				const auto group_name = child.ToString();
				if (name_collision_set.find(group_name) != name_collision_set.end()) {
					throw BinderException("Duplicate group name \"%s\" in %s", group_name, bound_function.name);
				}
				name_collision_set.insert(group_name);
				struct_children.emplace_back(make_pair(group_name, LogicalType::VARCHAR));
			}
			bound_function.return_type = LogicalType::STRUCT(struct_children);

			duckdb_re2::StringPiece constant_piece(constant_string.c_str(), constant_string.size());
			RE2 constant_pattern(constant_piece, options);
			if (size_t(constant_pattern.NumberOfCapturingGroups()) < list_children.size()) {
				throw BinderException("Not enough group names in %s", bound_function.name);
			}
		} else {
			auto group_idx = group.GetValue<int32_t>();
			if (group_idx < 0 || group_idx > 9) {
				throw InvalidInputException("Group index must be between 0 and 9!");
			}
			group_string = "\\" + to_string(group_idx);
		}
	}

	return make_uniq<RegexpExtractBindData>(options, std::move(constant_string), constant_pattern,
	                                        std::move(group_string));
}